

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O0

double __thiscall libDAI::LCLin::run(LCLin *this)

{
  bool bVar1;
  value vVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  long *plVar6;
  ulong uVar7;
  size_t sVar8;
  reference pvVar9;
  clock_t cVar10;
  void *this_00;
  long *in_RDI;
  double dVar11;
  size_t i_1;
  edge_type iI;
  size_t t;
  size_t k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> update_seq;
  size_t i;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  double md;
  Diffs diffs;
  clock_t tic;
  size_t in_stack_00000410;
  size_t in_stack_00000418;
  LCLin *in_stack_00000420;
  undefined4 in_stack_fffffffffffffd08;
  DistType in_stack_fffffffffffffd0c;
  LCLin *in_stack_fffffffffffffd10;
  value_type *in_stack_fffffffffffffd18;
  ostream *in_stack_fffffffffffffd20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd28;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffd30;
  long in_stack_fffffffffffffd38;
  Diffs *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  LCLin *in_stack_fffffffffffffd50;
  double in_stack_fffffffffffffd88;
  Diffs *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffe68;
  LCLin *in_stack_fffffffffffffe70;
  size_type local_100;
  size_type local_e8;
  size_type local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  ulong local_a0;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_98;
  double local_80;
  clock_t local_40;
  string local_28 [40];
  
  lVar3 = (**(code **)(*in_RDI + 0x30))();
  if (lVar3 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Starting ");
    (**(code **)(*in_RDI + 0x48))();
    poVar4 = std::operator<<(poVar4,local_28);
    std::operator<<(poVar4,"...");
    std::__cxx11::string::~string(local_28);
  }
  uVar5 = (**(code **)(*in_RDI + 0x30))();
  if (1 < uVar5) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  local_40 = toc();
  plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar6 + 0x28))();
  Diffs::Diffs(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (double)in_stack_fffffffffffffd30._M_current);
  local_80 = InitCavityDists(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                             (Properties *)in_stack_fffffffffffffd40);
  if ((double)in_RDI[0x34] < local_80) {
    in_RDI[0x34] = (long)local_80;
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb87a88)
  ;
  local_a0 = 0;
  while( true ) {
    uVar5 = local_a0;
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar7 = (**(code **)(*plVar6 + 0x28))();
    if (uVar7 <= uVar5) break;
    beliefV(in_stack_fffffffffffffd10,CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
    ;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_a0 = local_a0 + 1;
  }
  (**(code **)(*in_RDI + 0x28))();
  FactorGraph::nrEdges((FactorGraph *)0xb87b81);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb87bac);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffd30._M_current,(size_type)in_stack_fffffffffffffd28._M_current,
             (value_type_conflict2 *)in_stack_fffffffffffffd20,
             (allocator_type *)in_stack_fffffffffffffd18);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb87be0);
  local_d0 = 0;
  while( true ) {
    (**(code **)(*in_RDI + 0x28))();
    sVar8 = FactorGraph::nrEdges((FactorGraph *)0xb87c24);
    if (sVar8 <= local_d0) break;
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_b8,local_d0);
    *pvVar9 = local_d0;
    local_d0 = local_d0 + 1;
  }
  in_RDI[0x35] = 0;
  while( true ) {
    bVar1 = false;
    if ((ulong)in_RDI[0x35] < (ulong)in_RDI[0x27]) {
      in_stack_fffffffffffffe70 =
           (LCLin *)Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08
                                                ));
      bVar1 = (double)in_RDI[0x26] < (double)in_stack_fffffffffffffe70;
    }
    if (!bVar1) break;
    vVar2 = UpdateType::operator_cast_to_value((UpdateType *)(in_RDI + 0x23));
    if (vVar2 == SEQRND) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    }
    local_e8 = 0;
    while( true ) {
      (**(code **)(*in_RDI + 0x28))();
      sVar8 = FactorGraph::nrEdges((FactorGraph *)0xb87e13);
      if (sVar8 <= local_e8) break;
      (**(code **)(*in_RDI + 0x28))();
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_b8,local_e8);
      FactorGraph::edge((FactorGraph *)in_stack_fffffffffffffd10,
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      update(in_stack_00000420,in_stack_00000418,in_stack_00000410);
      local_e8 = local_e8 + 1;
    }
    local_100 = 0;
    while( true ) {
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar5 = (**(code **)(*plVar6 + 0x28))();
      if (uVar5 <= local_100) break;
      CalcBelief(in_stack_fffffffffffffe70,CONCAT44(vVar2,in_stack_fffffffffffffe68));
      beliefV(in_stack_fffffffffffffd10,
              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (&local_98,local_100);
      dist(in_stack_fffffffffffffd18,(TFactor<double> *)in_stack_fffffffffffffd10,
           in_stack_fffffffffffffd0c);
      Diffs::push(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      beliefV(in_stack_fffffffffffffd10,
              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (&local_98,local_100);
      TFactor<double>::operator=
                ((TFactor<double> *)in_stack_fffffffffffffd10,
                 (TFactor<double> *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      local_100 = local_100 + 1;
    }
    uVar5 = (**(code **)(*in_RDI + 0x30))();
    if (2 < uVar5) {
      poVar4 = std::operator<<((ostream *)&std::cout,Name);
      poVar4 = std::operator<<(poVar4,"::run:  maxdiff ");
      dVar11 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar11);
      poVar4 = std::operator<<(poVar4," after ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x35] + 1);
      poVar4 = std::operator<<(poVar4," passes");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    in_RDI[0x35] = in_RDI[0x35] + 1;
  }
  dVar11 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  if ((double)in_RDI[0x34] < dVar11) {
    dVar11 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    in_RDI[0x34] = (long)dVar11;
  }
  lVar3 = (**(code **)(*in_RDI + 0x30))();
  if (lVar3 != 0) {
    dVar11 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    if (dVar11 <= (double)in_RDI[0x26]) {
      uVar5 = (**(code **)(*in_RDI + 0x30))();
      if (1 < uVar5) {
        poVar4 = std::operator<<((ostream *)&std::cout,Name);
        std::operator<<(poVar4,"::run:  ");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"converged in ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x35]);
      poVar4 = std::operator<<(poVar4," passes (");
      cVar10 = toc();
      in_stack_fffffffffffffd20 = (ostream *)std::ostream::operator<<(poVar4,cVar10 - local_40);
      poVar4 = std::operator<<(in_stack_fffffffffffffd20," clocks).");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      lVar3 = (**(code **)(*in_RDI + 0x30))();
      if (lVar3 == 1) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,Name);
      poVar4 = std::operator<<(poVar4,"::run:  WARNING: not converged within ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[0x27]);
      poVar4 = std::operator<<(poVar4," passes (");
      cVar10 = toc();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,cVar10 - local_40);
      poVar4 = std::operator<<(poVar4," clocks)...final maxdiff:");
      dVar11 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      this_00 = (void *)std::ostream::operator<<(poVar4,dVar11);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  dVar11 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd20);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffd20);
  Diffs::~Diffs((Diffs *)0xb884ae);
  return dVar11;
}

Assistant:

double LCLin::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 2 )
            cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        double md = InitCavityDists(Props.cavainame, Props.cavaiopts);
        if( md > _maxdiff )
            _maxdiff = md;

        vector<Factor> old_beliefs;
        for(size_t i=0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(beliefV(i));

        vector<size_t> update_seq(grm().nrEdges(),0);
        for( size_t k=0; k < grm().nrEdges(); k++ )
            update_seq[k] = k;

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
            // Sequential updates
            if( Props.updates == UpdateType::SEQRND )
                random_shuffle( update_seq.begin(), update_seq.end() );
            
            for( size_t t=0; t < grm().nrEdges(); t++ ) {
                FactorGraph::edge_type iI = grm().edge(update_seq[t]);
                update( iI.first, iI.second );
            }

            // compare new beliefs with old ones
            for(size_t i=0; i < grm().nrVars(); i++ ) {
                CalcBelief(i);
                diffs.push( dist( beliefV(i), old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = beliefV(i);
            }

            if( Verbose() >= 3 )
                cout << Name << "::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                    cout << Name << "::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 2 )
                    cout << Name << "::run:  ";
                    cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }